

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathFreeCompExpr(xmlXPathCompExprPtr comp)

{
  xmlXPathObjectPtr pxVar1;
  xmlXPathStepOp *pxVar2;
  void *pvVar3;
  int iVar4;
  xmlDictPtr dict;
  long lVar5;
  long lVar6;
  
  if (comp != (xmlXPathCompExprPtr)0x0) {
    dict = comp->dict;
    iVar4 = comp->nbStep;
    if (dict == (xmlDictPtr)0x0) {
      if (0 < iVar4) {
        lVar5 = 0x20;
        lVar6 = 0;
        do {
          pxVar2 = comp->steps;
          pxVar1 = *(xmlXPathObjectPtr *)((long)pxVar2 + lVar5 + -8);
          if (pxVar1 != (xmlXPathObjectPtr)0x0) {
            if (*(int *)((long)pxVar2 + lVar5 + -0x20) == 0xb) {
              xmlXPathFreeObject(pxVar1);
            }
            else {
              (*xmlFree)(pxVar1);
            }
          }
          pvVar3 = *(void **)((long)&pxVar2->op + lVar5);
          if (pvVar3 != (void *)0x0) {
            (*xmlFree)(pvVar3);
          }
          lVar6 = lVar6 + 1;
          lVar5 = lVar5 + 0x38;
        } while (lVar6 < comp->nbStep);
      }
    }
    else {
      if (0 < iVar4) {
        lVar5 = 0;
        lVar6 = 0;
        do {
          pxVar1 = *(xmlXPathObjectPtr *)((long)&comp->steps->value4 + lVar5);
          if ((pxVar1 != (xmlXPathObjectPtr)0x0) &&
             (*(int *)((long)&comp->steps->op + lVar5) == 0xb)) {
            xmlXPathFreeObject(pxVar1);
            iVar4 = comp->nbStep;
          }
          lVar6 = lVar6 + 1;
          lVar5 = lVar5 + 0x38;
        } while (lVar6 < iVar4);
        dict = comp->dict;
      }
      xmlDictFree(dict);
    }
    if (comp->steps != (xmlXPathStepOp *)0x0) {
      (*xmlFree)(comp->steps);
    }
    if (comp->expr != (xmlChar *)0x0) {
      (*xmlFree)(comp->expr);
    }
    (*xmlFree)(comp);
    return;
  }
  return;
}

Assistant:

void
xmlXPathFreeCompExpr(xmlXPathCompExprPtr comp)
{
    xmlXPathStepOpPtr op;
    int i;

    if (comp == NULL)
        return;
    if (comp->dict == NULL) {
	for (i = 0; i < comp->nbStep; i++) {
	    op = &comp->steps[i];
	    if (op->value4 != NULL) {
		if (op->op == XPATH_OP_VALUE)
		    xmlXPathFreeObject(op->value4);
		else
		    xmlFree(op->value4);
	    }
	    if (op->value5 != NULL)
		xmlFree(op->value5);
	}
    } else {
	for (i = 0; i < comp->nbStep; i++) {
	    op = &comp->steps[i];
	    if (op->value4 != NULL) {
		if (op->op == XPATH_OP_VALUE)
		    xmlXPathFreeObject(op->value4);
	    }
	}
        xmlDictFree(comp->dict);
    }
    if (comp->steps != NULL) {
        xmlFree(comp->steps);
    }
#ifdef XPATH_STREAMING
    if (comp->stream != NULL) {
        xmlFreePatternList(comp->stream);
    }
#endif
    if (comp->expr != NULL) {
        xmlFree(comp->expr);
    }

    xmlFree(comp);
}